

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loadgamma.hpp
# Opt level: O2

vector<TensorEntry,_std::allocator<TensorEntry>_> *
symmetric_fold(vector<TensorEntry,_std::allocator<TensorEntry>_> *__return_storage_ptr__,
              vector<TensorEntry,_std::allocator<TensorEntry>_> *v)

{
  float fVar1;
  short sVar2;
  short sVar3;
  short sVar4;
  pointer pTVar5;
  pointer pTVar6;
  TensorEntry local_40;
  float local_34;
  
  (__return_storage_ptr__->super__Vector_base<TensorEntry,_std::allocator<TensorEntry>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<TensorEntry,_std::allocator<TensorEntry>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<TensorEntry,_std::allocator<TensorEntry>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  pTVar5 = (v->super__Vector_base<TensorEntry,_std::allocator<TensorEntry>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  for (pTVar6 = (v->super__Vector_base<TensorEntry,_std::allocator<TensorEntry>_>)._M_impl.
                super__Vector_impl_data._M_start; pTVar6 != pTVar5; pTVar6 = pTVar6 + 1) {
    sVar2 = pTVar6->a;
    sVar3 = pTVar6->b;
    sVar4 = pTVar6->c;
    fVar1 = pTVar6->val;
    local_40.val = fVar1;
    if (sVar2 < sVar3) {
      local_40.val = fVar1 + fVar1;
      local_40.a = sVar2;
      local_40.b = sVar3;
      local_40.c = sVar4;
      local_34 = fVar1;
      std::vector<TensorEntry,_std::allocator<TensorEntry>_>::emplace_back<TensorEntry>
                (__return_storage_ptr__,&local_40);
      local_40.val = local_34;
    }
    if (sVar2 == sVar3) {
      local_40.a = sVar2;
      local_40.b = sVar2;
      local_40.c = sVar4;
      std::vector<TensorEntry,_std::allocator<TensorEntry>_>::emplace_back<TensorEntry>
                (__return_storage_ptr__,&local_40);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<TensorEntry> symmetric_fold(std::vector<TensorEntry> v)
{
	std::vector<TensorEntry> res;
	for (auto e: v) {
		if (e.a < e.b)
			res.push_back({e.a, e.b, e.c, e.val*2});
		if (e.a == e.b)
			res.push_back({e.a, e.b, e.c, e.val});
	}
	return res;
}